

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallHeapBlockAllocator.cpp
# Opt level: O2

void __thiscall
Memory::SmallHeapBlockAllocator<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
TrackNativeAllocatedObjects
          (SmallHeapBlockAllocator<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
           *this)

{
  undefined4 *puVar1;
  HeapBucket *pHVar2;
  Recycler *pRVar3;
  code *pcVar4;
  bool bVar5;
  ulong uVar6;
  FreeObject *pFVar7;
  undefined8 *in_FS_OFFSET;
  
  if ((this->freeObjectList == (FreeObject *)0x0) || (this->endAddress == (char *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0xd3,"(this->freeObjectList != nullptr && endAddress != nullptr)",
                       "this->freeObjectList != nullptr && endAddress != nullptr");
    if (!bVar5) goto LAB_002b1e73;
    *puVar1 = 0;
  }
  if (this->heapBlock == (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0xd4,"(this->heapBlock != nullptr)","this->heapBlock != nullptr");
    if (!bVar5) goto LAB_002b1e73;
    *puVar1 = 0;
  }
  if (this->pfnTrackNativeAllocatedObjectCallBack != (_func_void_Recycler_ptr_void_ptr_size_t *)0x0)
  {
    if (this->lastNonNativeBumpAllocatedBlock == (char *)0x0) {
      if (this->freeObjectList !=
          (FreeObject *)
          (this->heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).super_HeapBlock.
          address) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar1 = (undefined4 *)*in_FS_OFFSET;
        *puVar1 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                           ,0xde,"((char *)this->freeObjectList == this->heapBlock->GetAddress())",
                           "(char *)this->freeObjectList == this->heapBlock->GetAddress()");
        if (!bVar5) goto LAB_002b1e73;
        *puVar1 = 0;
      }
    }
    else {
      pHVar2 = (this->heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).heapBucket;
      pRVar3 = pHVar2->heapInfo->recycler;
      uVar6 = (ulong)pHVar2->sizeCat;
      pFVar7 = (FreeObject *)(this->lastNonNativeBumpAllocatedBlock + uVar6);
      if (this->freeObjectList < pFVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar1 = (undefined4 *)*in_FS_OFFSET;
        *puVar1 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                           ,0xe5,"(curr <= (char *)this->freeObjectList)",
                           "curr <= (char *)this->freeObjectList");
        if (!bVar5) {
LAB_002b1e73:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar1 = 0;
      }
      if ((pRVar3->recyclerFlagsTable->Verbose == true) &&
         (bVar5 = Js::Phases::IsEnabled(&pRVar3->recyclerFlagsTable->Trace,MemoryAllocationPhase),
         bVar5)) {
        Output::Print(L"TrackNativeAllocatedObjects: recycler = 0x%p, sizeCat = %u, lastRuntimeAllocatedBlock = 0x%p, freeObjectList = 0x%p, nativeAllocatedObjectCount = %u\n"
                      ,pRVar3,uVar6,this->lastNonNativeBumpAllocatedBlock,this->freeObjectList,
                      (ulong)((long)this->freeObjectList - (long)pFVar7) / uVar6);
      }
      for (; pFVar7 < this->freeObjectList;
          pFVar7 = (FreeObject *)((long)&pFVar7->taggedNext + uVar6)) {
        (*this->pfnTrackNativeAllocatedObjectCallBack)(pRVar3,pFVar7,uVar6);
      }
    }
  }
  return;
}

Assistant:

void
SmallHeapBlockAllocator<TBlockType>::TrackNativeAllocatedObjects()
{
    Assert(this->freeObjectList != nullptr && endAddress != nullptr);
    Assert(this->heapBlock != nullptr);

#if defined(PROFILE_RECYCLER_ALLOC) || defined(RECYCLER_MEMORY_VERIFY) || defined(MEMSPECT_TRACKING) || defined(ETW_MEMORY_TRACKING)
    if (pfnTrackNativeAllocatedObjectCallBack == nullptr)
    {
        return;
    }

    if (lastNonNativeBumpAllocatedBlock == nullptr)
    {
        Assert((char *)this->freeObjectList == this->heapBlock->GetAddress());
        return;
    }

    Recycler * recycler = this->heapBlock->heapBucket->heapInfo->recycler;
    size_t sizeCat = this->heapBlock->heapBucket->sizeCat;
    char * curr = lastNonNativeBumpAllocatedBlock + sizeCat;
    Assert(curr <= (char *)this->freeObjectList);

#if DBG_DUMP
    AllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("TrackNativeAllocatedObjects: recycler = 0x%p, sizeCat = %u, lastRuntimeAllocatedBlock = 0x%p, freeObjectList = 0x%p, nativeAllocatedObjectCount = %u\n"),
        recycler, sizeCat, this->lastNonNativeBumpAllocatedBlock, this->freeObjectList, ((char *)this->freeObjectList - curr) / sizeCat);
#endif

    while (curr < (char *)this->freeObjectList)
    {
        pfnTrackNativeAllocatedObjectCallBack(recycler, curr, sizeCat);
        curr += sizeCat;
    }
#elif defined(RECYCLER_PERF_COUNTERS)
    if (lastNonNativeBumpAllocatedBlock == nullptr)
    {
        return;
    }

    size_t sizeCat = this->heapBlock->heapBucket->sizeCat;
    char * curr = lastNonNativeBumpAllocatedBlock + sizeCat;
    Assert(curr <= (char *)this->freeObjectList);
    size_t byteCount = ((char *)this->freeObjectList - curr);

#if DBG_DUMP
    AllocationVerboseTrace(_u("TrackNativeAllocatedObjects: recycler = 0x%p, sizeCat = %u, lastRuntimeAllocatedBlock = 0x%p, freeObjectList = 0x%p, nativeAllocatedObjectCount = %u\n"),
        recycler, sizeCat, this->lastNonNativeBumpAllocatedBlock, this->freeObjectList, ((char *)this->freeObjectList - curr) / sizeCat);
#endif

    RECYCLER_PERF_COUNTER_ADD(LiveObject, byteCount / sizeCat);
    RECYCLER_PERF_COUNTER_ADD(LiveObjectSize, byteCount);
    RECYCLER_PERF_COUNTER_SUB(FreeObjectSize, byteCount);
    RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockLiveObject, byteCount / sizeCat);
    RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockLiveObjectSize, byteCount);
    RECYCLER_PERF_COUNTER_SUB(SmallHeapBlockFreeObjectSize, byteCount);
#else
#error Not implemented
#endif
}